

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

int __thiscall
CTPNConst::gen_code_asi
          (CTPNConst *this,int discard,int phase,tc_asitype_t typ,char *op,CTcPrsNode *param_6,
          int ignore_errors,int param_8,void **param_9)

{
  int in_ECX;
  int in_EDX;
  int iVar2;
  undefined8 in_R8;
  bool bVar1;
  
  if (((int)param_6 == 0) && (in_EDX < 2)) {
    bVar1 = true;
    if ((in_ECX != 0xc) && ((bVar1 = true, in_ECX != 0xd && (bVar1 = true, in_ECX != 0xe)))) {
      bVar1 = in_ECX == 0xf;
    }
    _iVar2 = 0x2afc;
    if (bVar1) {
      _iVar2 = 0x2afe;
    }
    CTcTokenizer::log_error(_iVar2,in_R8);
  }
  return 0;
}

Assistant:

int CTPNConst::gen_code_asi(int discard, int phase,
                            tc_asitype_t typ, const char *op,
                            CTcPrsNode *, 
                            int ignore_errors, int, void **)
{
    /* 
     *   If ignoring errors, just indicate that we can't do the assignment.
     *   Also ignore errors on phase 2, since we'll already have generated an
     *   error during phase 1. 
     */
    if (ignore_errors || phase > 1)
        return FALSE;

    /* 
     *   We can't assign to a constant.  The parser will catch most errors of
     *   this type before we ever get here, but for expressions that resolve
     *   to global symbols (such as objects or functions), it can't know
     *   until code generation time that the expression won't be assignable. 
     */
    G_tok->log_error(typ == TC_ASI_PREINC || typ == TC_ASI_PREDEC
                     || typ == TC_ASI_POSTINC || typ == TC_ASI_POSTDEC
                     ? TCERR_INVALID_UNARY_LVALUE : TCERR_INVALID_LVALUE,
                     op);
    return FALSE;
}